

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrStructureTypeToString
                   (XrInstance instance,XrStructureType value,char *buffer)

{
  bool bVar1;
  ValidateXrHandleResult VVar2;
  GenValidUsageXrInstanceInfo *instance_info;
  size_t sVar3;
  XrResult XVar4;
  undefined4 in_stack_fffffffffffffd98;
  uint32_t in_stack_fffffffffffffd9c;
  string local_260;
  string local_240;
  XrInstance instance_local;
  string local_218;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 1;
  instance_local = instance;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrInstance_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&instance_local,(XrObjectType *)&oss);
  VVar2 = VerifyXrInstanceHandle(&instance_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    instance_info =
         HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                   (&g_instance_info.
                     super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                    instance_local);
    std::__cxx11::string::string((string *)&oss,"xrStructureTypeToString",(allocator *)&local_218);
    std::__cxx11::string::string
              ((string *)&local_260,"xrStructureTypeToString",(allocator *)&stack0xfffffffffffffd9f)
    ;
    std::__cxx11::string::string((string *)&local_240,"value",(allocator *)&stack0xfffffffffffffd9e)
    ;
    bVar1 = ValidateXrEnum(instance_info,(string *)&oss,&local_260,&local_240,&objects_info,value);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&oss);
    if (bVar1) {
      sVar3 = strlen(buffer);
      XVar4 = XR_SUCCESS;
      if (sVar3 < 0x41) goto LAB_001beba0;
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrStructureTypeToString-buffer-parameter",
                 (allocator *)&local_218);
      std::__cxx11::string::string
                ((string *)&local_260,"xrStructureTypeToString",
                 (allocator *)&stack0xfffffffffffffd9f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1e0,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_240,
                 "Command xrStructureTypeToString param buffer length is too long.",
                 (allocator *)&stack0xfffffffffffffd9e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_260,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1e0,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1e0);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&oss);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      std::operator<<((ostream *)&oss,"Invalid XrStructureType \"value\" enum value ");
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd9c);
      std::operator<<((ostream *)&oss,(string *)&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::string
                ((string *)&local_260,"VUID-xrStructureTypeToString-value-parameter",
                 (allocator *)&stack0xfffffffffffffd9f);
      std::__cxx11::string::string
                ((string *)&local_240,"xrStructureTypeToString",
                 (allocator *)&stack0xfffffffffffffd9e);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1c8,&objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_260,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_240,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1c8,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1c8);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    }
    XVar4 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrInstance handle \"instance\" ");
    HandleToHexString<XrInstance_T*>
              ((XrInstance_T *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    std::operator<<((ostream *)&oss,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::string
              ((string *)&local_260,"VUID-xrStructureTypeToString-instance-parameter",
               (allocator *)&stack0xfffffffffffffd9f);
    std::__cxx11::string::string
              ((string *)&local_240,"xrStructureTypeToString",(allocator *)&stack0xfffffffffffffd9e)
    ;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_260,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_240,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b0,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b0);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar4 = XR_ERROR_HANDLE_INVALID;
  }
LAB_001beba0:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar4;
}

Assistant:

XrResult GenValidUsageInputsXrStructureTypeToString(
XrInstance instance,
XrStructureType value,
char buffer[XR_MAX_STRUCTURE_NAME_SIZE]) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(instance, XR_OBJECT_TYPE_INSTANCE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrInstanceHandle(&instance);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrInstance handle \"instance\" ";
                oss << HandleToHexString(instance);
                CoreValidLogMessage(nullptr, "VUID-xrStructureTypeToString-instance-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrStructureTypeToString",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        (void)gen_instance_info;  // quiet warnings
        // Make sure the enum type XrStructureType value is valid
        if (!ValidateXrEnum(gen_instance_info, "xrStructureTypeToString", "xrStructureTypeToString", "value", objects_info, value)) {
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrStructureType \"value\" enum value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(value));
            CoreValidLogMessage(gen_instance_info, "VUID-xrStructureTypeToString-value-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrStructureTypeToString",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        if (XR_MAX_STRUCTURE_NAME_SIZE < std::strlen(buffer)) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrStructureTypeToString-buffer-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrStructureTypeToString",
                                objects_info,
                                "Command xrStructureTypeToString param buffer length is too long.");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}